

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

bool __thiscall Js::JavascriptPromise::WillRejectionBeUnhandled(JavascriptPromise *this)

{
  NodeBase **addr;
  SListNodeBase<Memory::Recycler> *pSVar1;
  JavascriptPromiseReaction *pJVar2;
  Var aValue;
  RecyclableObject *obj;
  FunctionInfo *pFVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  JavascriptPromise *pJVar11;
  Type *pTVar12;
  JavascriptFunction *pJVar13;
  EntryType *pEVar14;
  undefined1 local_c8 [8];
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  visited;
  undefined1 local_88 [8];
  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> stack;
  Iterator it;
  byte local_34;
  
  local_34 = this->isHandled ^ 1;
  if (this->isHandled == true) {
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    buffer._0_4_ = 0;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _16_8_ = &Memory::HeapAllocator::Instance;
    visited.stats = (DictionaryStats *)&PTR_IsReadOnly_01545380;
    local_88 = (undefined1  [8])&PTR_IsReadOnly_01545380;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    alloc = (Type)0x400000000;
    local_c8 = (undefined1  [8])&Memory::HeapAllocator::Instance;
    visited.free = (EntryType *)0x4000000000;
    visited.count = 0;
    visited.freecount = 0x4b;
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Initialize((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                  *)local_c8);
    JsUtil::
    List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)local_88,0);
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList
    [(int)stack.list.
          super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.buffer
    ] = (_func_int *)this;
    stack.list.super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
    buffer._0_4_ = (int)stack.list.
                        super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                        .buffer + 1;
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
           *)local_c8,this,1);
    if ((int)stack.list.
             super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
             buffer != 0) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      addr = &it.current;
      do {
        pJVar11 = JsUtil::
                  Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
                            ((Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>
                              *)local_88);
        stack.list._40_8_ = (pJVar11->reactions).ptr;
        it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                  stack.list._40_8_;
        do {
          if (it.list ==
              (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_00d005cf;
            *puVar10 = 0;
          }
          uVar5 = stack.list._40_8_;
          pSVar1 = ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
          Memory::Recycler::WBSetBit((char *)addr);
          it.current = pSVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          if (it.current == (NodeBase *)uVar5) {
            it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                      0x0;
            break;
          }
          pSVar1 = ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
          Memory::Recycler::WBSetBit((char *)addr);
          it.current = pSVar1;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                    it.current;
          pTVar12 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::
                    Iterator::Data((Iterator *)&stack.list.field_0x28);
          pJVar2 = pTVar12->rejectReaction;
          aValue = (((pJVar2->capabilities).ptr)->promise).ptr;
          bVar7 = VarIs<Js::JavascriptPromise>(aValue);
          bVar6 = true;
          if (bVar7) {
            pJVar11 = VarTo<Js::JavascriptPromise>(aValue);
            if (pJVar11->isHandled == false) {
              obj = (pJVar2->handler).ptr;
              bVar8 = VarIsImpl<Js::JavascriptFunction>(obj);
              bVar7 = true;
              if (bVar8) {
                pJVar13 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
                pFVar3 = (pJVar13->functionInfo).ptr;
                iVar9 = (*(pJVar13->super_DynamicObject).super_RecyclableObject.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[0x66])(pJVar13);
                if ((iVar9 == 0) &&
                   ((((((((((((pJVar13->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                        ->super_ScriptContextBase).javascriptLibrary)->throwerFunction).ptr)->
                    functionInfo).ptr != (FunctionInfo *)EntryInfo::Thrower)) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                              ,0x541,
                                              "(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower)"
                                              ,"unexpected FunctionInfo for thrower function!");
                  if (!bVar7) goto LAB_00d005cf;
                  *puVar10 = 0;
                }
                bVar7 = pFVar3 != (FunctionInfo *)EntryInfo::Thrower;
                if (!bVar7) {
                  local_34 = 1;
                }
              }
              if (!bVar7) {
                bVar6 = false;
                goto LAB_00d0055e;
              }
            }
            pEVar14 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                      ::FindEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                                   *)local_c8,pJVar11);
            if (pEVar14 != (EntryType *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                          ,0x54e,"(visited.HasEntry(p) == false)",
                                          "Unexpected cycle in promise reaction tree!");
              if (!bVar7) {
LAB_00d005cf:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar10 = 0;
            }
            pEVar14 = SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                      ::FindEntry((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                                   *)local_c8,pJVar11);
            if (pEVar14 == (EntryType *)0x0) {
              JsUtil::
              List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray((List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             *)local_88,0);
              stack.list.
              super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
              _vptr_ReadOnlyList
              [(int)stack.list.
                    super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                    .buffer] = (_func_int *)pJVar11;
              stack.list.
              super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
              buffer._0_4_ = (int)stack.list.
                                  super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                                  .buffer + 1;
              SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              ::Add((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                     *)local_c8,pJVar11,1);
            }
          }
LAB_00d0055e:
        } while (bVar6);
      } while (((local_34 & 1) == 0) &&
              ((int)stack.list.
                    super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                    .buffer != 0));
    }
    SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
    ::~SimpleHashTable((SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
                        *)local_c8);
    local_88 = (undefined1  [8])visited.stats;
    if (stack.list.
        super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::HeapAllocator::Free
                ((HeapAllocator *)
                 stack.list.
                 super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                 ._16_8_,stack.list.
                         super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                         ._vptr_ReadOnlyList,
                 (long)(int)stack.list.
                            super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                            .alloc << 3);
    }
  }
  return (bool)(local_34 & 1);
}

Assistant:

bool JavascriptPromise::WillRejectionBeUnhandled()
    {
        bool willBeUnhandled = !this->GetIsHandled();
        if (!willBeUnhandled)
        {
            // if this promise is handled, then we need to do a depth-first search over this promise's reject
            // reactions. If we find a reaction that
            //    - associated promise is "unhandled" (ie, it's never been "then'd")
            //    - AND its rejection handler is our default "thrower function"
            // then this promise results in an unhandled rejection path.

            JsUtil::Stack<JavascriptPromise*, HeapAllocator> stack(&HeapAllocator::Instance);
            SimpleHashTable<JavascriptPromise*, int, HeapAllocator> visited(&HeapAllocator::Instance);
            stack.Push(this);
            visited.Add(this, 1);

            while (!willBeUnhandled && !stack.Empty())
            {
                JavascriptPromise * curr = stack.Pop();
                {
                    JavascriptPromiseReactionList* reactions = curr->GetReactions();
                    JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
                    while (it.Next())
                    {
                        JavascriptPromiseReactionPair pair = it.Data();
                        JavascriptPromiseReaction* reaction = pair.rejectReaction;
                        Var promiseVar = reaction->GetCapabilities()->GetPromise();

                        if (VarIs<JavascriptPromise>(promiseVar))
                        {
                            JavascriptPromise* p = VarTo<JavascriptPromise>(promiseVar);
                            if (!p->GetIsHandled())
                            {
                                RecyclableObject* handler = reaction->GetHandler();
                                if (VarIs<JavascriptFunction>(handler))
                                {
                                    JavascriptFunction* func = VarTo<JavascriptFunction>(handler);
                                    FunctionInfo* functionInfo = func->GetFunctionInfo();

#ifdef DEBUG
                                    if (!func->IsCrossSiteObject())
                                    {
                                        // assert that Thrower function's FunctionInfo hasn't changed
                                        AssertMsg(func->GetScriptContext()->GetLibrary()->GetThrowerFunction()->GetFunctionInfo() == &JavascriptPromise::EntryInfo::Thrower, "unexpected FunctionInfo for thrower function!");
                                    }
#endif

                                    // If the function info is the default thrower function's function info, then assume that this is unhandled
                                    // this will work across script contexts
                                    if (functionInfo == &JavascriptPromise::EntryInfo::Thrower)
                                    {
                                        willBeUnhandled = true;
                                        break;
                                    }
                                }
                            }
                            AssertMsg(visited.HasEntry(p) == false, "Unexpected cycle in promise reaction tree!");
                            if (!visited.HasEntry(p))
                            {
                                stack.Push(p);
                                visited.Add(p, 1);
                            }
                        }
                    }
                }
            }
        }
        return willBeUnhandled;
    }